

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_CutCompareArea(Of_Cut_t *pCut0,Of_Cut_t *pCut1)

{
  Of_Cut_t *pCut1_local;
  Of_Cut_t *pCut0_local;
  
  if (pCut0->Delay < pCut1->Delay) {
    pCut0_local._4_4_ = -1;
  }
  else if (pCut1->Delay < pCut0->Delay) {
    pCut0_local._4_4_ = 1;
  }
  else if (pCut0->Flow < pCut1->Flow) {
    pCut0_local._4_4_ = -1;
  }
  else if (pCut1->Flow < pCut0->Flow) {
    pCut0_local._4_4_ = 1;
  }
  else if (*(uint *)&pCut0->field_0x10 >> 0x1b < *(uint *)&pCut1->field_0x10 >> 0x1b) {
    pCut0_local._4_4_ = -1;
  }
  else if (*(uint *)&pCut1->field_0x10 >> 0x1b < *(uint *)&pCut0->field_0x10 >> 0x1b) {
    pCut0_local._4_4_ = 1;
  }
  else {
    pCut0_local._4_4_ = 0;
  }
  return pCut0_local._4_4_;
}

Assistant:

static inline int Of_CutCompareArea( Of_Cut_t * pCut0, Of_Cut_t * pCut1 )
{
    if ( pCut0->Delay   < pCut1->Delay   )  return -1;
    if ( pCut0->Delay   > pCut1->Delay   )  return  1;
    if ( pCut0->Flow    < pCut1->Flow    )  return -1;
    if ( pCut0->Flow    > pCut1->Flow    )  return  1;
    if ( pCut0->nLeaves < pCut1->nLeaves )  return -1;
    if ( pCut0->nLeaves > pCut1->nLeaves )  return  1;
    return 0;
}